

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::BitfieldInsertCaseInstance::getInputValues
          (BitfieldInsertCaseInstance *this,int numValues,void **values)

{
  ShaderType shaderType;
  DataType dataType;
  int iVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  deUint32 dVar7;
  int in_R9D;
  ulong uVar8;
  uint uVar9;
  Random rnd;
  deRandom local_40;
  
  dVar7 = deStringHash((this->super_IntegerFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar7 ^ 0x12c2acff);
  pSVar2 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  shaderType = (pSVar2->varType).m_data.basic.type;
  dataType = *(DataType *)((long)&(pSVar2->varType).m_data + 4);
  pvVar3 = *values;
  pvVar4 = values[1];
  if (0 < numValues) {
    pvVar5 = values[2];
    pvVar6 = values[3];
    iVar1 = *(int *)(&DAT_00b2ceb8 + (ulong)dataType * 4);
    uVar8 = 0;
    do {
      dVar7 = deRandom_getUint32(&local_40);
      uVar9 = dVar7 % (iVar1 + 1U);
      dVar7 = deRandom_getUint32(&local_40);
      *(uint *)((long)pvVar5 + uVar8 * 4) = dVar7 % ((iVar1 + 1U) - uVar9);
      *(uint *)((long)pvVar6 + uVar8 * 4) = uVar9;
      uVar8 = uVar8 + 1;
    } while ((uint)numValues != uVar8);
  }
  shaderexecutor::anon_unknown_0::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar3,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  shaderexecutor::anon_unknown_0::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar4,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0x12c2acff);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				numBits		= getShaderUintBitCount(m_shaderType, precision);
		deUint32*				inBase		= (deUint32*)values[0];
		deUint32*				inInsert	= (deUint32*)values[1];
		int*					inOffset	= (int*)values[2];
		int*					inBits		= (int*)values[3];

		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
		{
			const int bits		= rnd.getInt(0, numBits);
			const int offset	= rnd.getInt(0, numBits-bits);

			inOffset[valueNdx]	= offset;
			inBits[valueNdx]	= bits;
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, inBase, numValues);
		generateRandomInputData(rnd, m_shaderType, type, precision, inInsert, numValues);
	}